

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void superblock_recovery_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  fdb_status err_code;
  __pid_t __pid;
  fdb_status err_code_00;
  int iVar3;
  char *pcVar4;
  fdb_status s_18;
  fdb_status s_17;
  fdb_status s_16;
  fdb_status s_15;
  fdb_status s_14;
  fdb_status s_13;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_status status;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_seqnum_t seqno;
  pid_t child_id;
  char bodybuf [256];
  char keybuf [256];
  size_t rvalue_len;
  void *rvalue;
  uint64_t num_markers;
  uint64_t i;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  uint64_t *in_stack_00000b88;
  fdb_snapshot_info_t **in_stack_00000b90;
  fdb_file_handle *in_stack_00000b98;
  fdb_kvs_handle *in_stack_fffffffffffffa28;
  fdb_file_handle *in_stack_fffffffffffffa30;
  FILE *pFVar5;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  void **in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  fdb_file_info *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  fdb_status in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffbe8;
  fdb_status in_stack_fffffffffffffbec;
  ulong local_3e0;
  fdb_config *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  fdb_file_handle **in_stack_fffffffffffffc58;
  fdb_seqnum_t in_stack_fffffffffffffcd0;
  fdb_kvs_handle **in_stack_fffffffffffffcd8;
  fdb_kvs_handle *in_stack_fffffffffffffce0;
  long local_2f0;
  char local_278 [256];
  char local_178 [256];
  size_t local_78;
  void *local_70;
  long local_68;
  ulong local_60;
  int local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_54 = system("rm -rf  staleblktest* > errorlog.txt");
  fVar1 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x60b);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x60b,"void superblock_recovery_test()");
  }
  fVar1 = fdb_kvs_open((fdb_file_handle *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                       (fdb_kvs_handle **)
                       CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                       (fdb_kvs_config *)
                       CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x60d);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x60d,"void superblock_recovery_test()");
  }
  for (local_60 = 0; local_60 < local_2f0 + 1U; local_60 = local_60 + 1) {
    sprintf(local_178,"key");
    strlen(local_178);
    in_stack_fffffffffffffbec =
         fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                    in_stack_fffffffffffffa60,
                    CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                    in_stack_fffffffffffffa50,
                    CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    pFVar5 = _stderr;
    if (in_stack_fffffffffffffbec != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(in_stack_fffffffffffffbec);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",
              (ulong)(uint)in_stack_fffffffffffffbec,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x613);
      superblock_recovery_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x613,"void superblock_recovery_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa28,'\0');
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x615);
      superblock_recovery_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x615,"void superblock_recovery_test()");
    }
    in_stack_fffffffffffffbe8 = 0;
  }
  fVar1 = fdb_get_file_info((fdb_file_handle *)
                            CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                            in_stack_fffffffffffffa60);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x619);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x619,"void superblock_recovery_test()");
  }
  uVar6 = 0;
  while (local_3e0 < 0x1000000) {
    sprintf(local_178,"key");
    sprintf(local_278,"body%d",local_60 & 0xffffffff);
    strlen(local_178);
    strlen(local_278);
    in_stack_fffffffffffffbe0 =
         fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                    in_stack_fffffffffffffa60,
                    CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                    in_stack_fffffffffffffa50,
                    CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    pFVar5 = _stderr;
    if (in_stack_fffffffffffffbe0 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(in_stack_fffffffffffffbe0);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",
              (ulong)(uint)in_stack_fffffffffffffbe0,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x620);
      superblock_recovery_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x620,"void superblock_recovery_test()");
    }
    fVar1 = fdb_get_file_info((fdb_file_handle *)
                              CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                              in_stack_fffffffffffffa60);
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x622);
      superblock_recovery_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x622,"void superblock_recovery_test()");
    }
    in_stack_fffffffffffffbdc = 0;
  }
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                    );
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x625);
    superblock_recovery_test::__test_pass = 0;
    sVar2 = sb_check_block_reusing
                      ((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_check_block_reusing(db) == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x625,"void superblock_recovery_test()");
    }
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffffa28);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x629);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x629,"void superblock_recovery_test()");
  }
  err_code = fdb_close((fdb_file_handle *)in_stack_fffffffffffffa28);
  pFVar5 = _stderr;
  if (err_code != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(err_code);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)err_code,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x62b);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x62b,"void superblock_recovery_test()");
  }
  __pid = fork();
  if (__pid == 0) {
    child_function();
  }
  sleep(3);
  kill(__pid,10);
  err_code_00 = fdb_open(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                         in_stack_fffffffffffffc48);
  pFVar5 = _stderr;
  if (err_code_00 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(err_code_00);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)err_code_00,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x63c);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x63c,"void superblock_recovery_test()");
  }
  fVar1 = fdb_kvs_open((fdb_file_handle *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                       (fdb_kvs_handle **)CONCAT44(uVar6,in_stack_fffffffffffffbe0),
                       (char *)CONCAT44(in_stack_fffffffffffffbdc,fVar1),
                       (fdb_kvs_config *)((ulong)(uint)err_code << 0x20));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x63e);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x63e,"void superblock_recovery_test()");
  }
  sprintf(local_178,"key0");
  strlen(local_178);
  fVar1 = fdb_get_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
                     ,in_stack_fffffffffffffa60,
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                     in_stack_fffffffffffffa50,
                     (size_t *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x643);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x643,"void superblock_recovery_test()");
  }
  fVar1 = fdb_free_block((void *)0x111adf);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x645);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x645,"void superblock_recovery_test()");
  }
  fVar1 = fdb_get_all_snap_markers(in_stack_00000b98,in_stack_00000b90,in_stack_00000b88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x649);
    superblock_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x649,"void superblock_recovery_test()");
    }
  }
  if (local_68 != local_2f0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x64a);
    superblock_recovery_test::__test_pass = 0;
    if (local_68 != local_2f0) {
      __assert_fail("num_markers == fconfig.num_keeping_headers",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x64a,"void superblock_recovery_test()");
    }
  }
  fVar1 = fdb_compact_upto(in_stack_fffffffffffffa30,(char *)in_stack_fffffffffffffa28,0x111c95);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x64c);
    superblock_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x64c,"void superblock_recovery_test()");
    }
  }
  fVar1 = fdb_snapshot_open(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                            in_stack_fffffffffffffcd0);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x651);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x651,"void superblock_recovery_test()");
  }
  fVar1 = fdb_free_snap_markers
                    ((fdb_snapshot_info_t *)
                     CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                     (uint64_t)in_stack_fffffffffffffa30);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x654);
    superblock_recovery_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x654,"void superblock_recovery_test()");
    }
  }
  sprintf(local_178,"key0");
  strlen(local_178);
  fVar1 = fdb_get_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
                     ,in_stack_fffffffffffffa60,
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                     in_stack_fffffffffffffa50,
                     (size_t *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x659);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x659,"void superblock_recovery_test()");
  }
  iVar3 = memcmp(local_70,"seqno0",local_78);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","seqno0",local_70,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x65c);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x65c,"void superblock_recovery_test()");
  }
  fVar1 = fdb_free_block((void *)0x111fcb);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x65e);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x65e,"void superblock_recovery_test()");
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffffa28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x661);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x661,"void superblock_recovery_test()");
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffffa28);
  pFVar5 = _stderr;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffa28);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      if (superblock_recovery_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","superblock recovery test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","superblock recovery test");
      }
      return;
    }
    pFVar5 = _stderr;
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x665);
    superblock_recovery_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x665,"void superblock_recovery_test()");
  }
  pcVar4 = fdb_error_msg(fVar1);
  fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x663);
  superblock_recovery_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x663,"void superblock_recovery_test()");
}

Assistant:

void superblock_recovery_test() {
    TEST_INIT();
    memleak_start();

    int r;
    uint64_t i, num_markers;
    void *rvalue;
    size_t rvalue_len;
    char keybuf[256];
    char bodybuf[256];
    pid_t child_id;

    fdb_seqnum_t seqno;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fdb_file_info file_info;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    for (i = 0; i < fconfig.num_keeping_headers + 1; i++) {
        sprintf(keybuf, "key");
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);

    while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE) {
        sprintf(keybuf, "key");
        sprintf(bodybuf, "body%d", static_cast<int>(i));
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    };

    TEST_CHK(sb_check_block_reusing(db) == SBD_RECLAIM);

    // close previous handle
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);

    // fork child
    child_id = fork();

    if (child_id == 0) {
        child_function();
    }

    // wait 3s
    sleep(3);

    // kill child
    kill(child_id, SIGUSR1);
    // reopen and recover

    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    // get known key
    sprintf(keybuf, "key0");
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);

    // compact upto marker
    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(num_markers == fconfig.num_keeping_headers);
    status = fdb_compact_upto(dbfile, NULL, markers[4].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open snapshot on marker
    seqno = markers[4].kvs_markers->seqnum;
    status = fdb_snapshot_open(db, &snap_db, seqno);
    TEST_STATUS(status);

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get known key
    sprintf(keybuf, "key0");
    status = fdb_get_kv(snap_db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // check value
    TEST_CMP(rvalue, "seqno0", rvalue_len);
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);

    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("superblock recovery test");
}